

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_SetFlagValueTest_IllegalValues::Run(void)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  string local_40;
  FlagSaver fs;
  
  FlagSaver::FlagSaver(&fs);
  pcVar2 = "IllegalValues";
  fprintf(_stderr,"Running test %s/%s\n","SetFlagValueTest");
  fLB::FLAGS_test_bool = '\x01';
  fLI::FLAGS_test_int32 = 0x77;
  fLI64::FLAGS_test_int64 = 0x4a7;
  fLU::FLAGS_test_uint32 = 0x2e87;
  fLU64::FLAGS_test_uint64 = 0x1d147;
  SetCommandLineOption_abi_cxx11_(&local_40,(gflags *)0x14c2e1,"12",pcVar2);
  bVar1 = std::operator==("",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    SetCommandLineOption_abi_cxx11_(&local_40,(gflags *)0x14b8f5,"-1970",pcVar2);
    bVar1 = std::operator==("",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar1) {
      SetCommandLineOption_abi_cxx11_(&local_40,(gflags *)0x14c7dc,"7000000000000",pcVar2);
      bVar1 = std::operator==("",&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if (bVar1) {
        SetCommandLineOption_abi_cxx11_(&local_40,(gflags *)0x14b90e,"-1",pcVar2);
        bVar1 = std::operator==("",&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        if (bVar1) {
          SetCommandLineOption_abi_cxx11_(&local_40,(gflags *)0x14b8de,"not a number!",pcVar2);
          bVar1 = std::operator==("",&local_40);
          std::__cxx11::string::~string((string *)&local_40);
          if (bVar1) {
            SetCommandLineOption_abi_cxx11_(&local_40,(gflags *)0x14c2e1,"",pcVar2);
            bVar1 = std::operator==("",&local_40);
            std::__cxx11::string::~string((string *)&local_40);
            if (bVar1) {
              SetCommandLineOption_abi_cxx11_(&local_40,(gflags *)0x14c7dc,"",pcVar2);
              bVar1 = std::operator==("",&local_40);
              std::__cxx11::string::~string((string *)&local_40);
              if (bVar1) {
                SetCommandLineOption_abi_cxx11_(&local_40,(gflags *)0x14b8de,"",pcVar2);
                bVar1 = std::operator==("",&local_40);
                std::__cxx11::string::~string((string *)&local_40);
                if (bVar1) {
                  SetCommandLineOption_abi_cxx11_(&local_40,(gflags *)0x14b8f5,"",pcVar2);
                  bVar1 = std::operator==("",&local_40);
                  std::__cxx11::string::~string((string *)&local_40);
                  if (bVar1) {
                    SetCommandLineOption_abi_cxx11_(&local_40,(gflags *)0x14b90e,"",pcVar2);
                    bVar1 = std::operator==("",&local_40);
                    std::__cxx11::string::~string((string *)&local_40);
                    if (bVar1) {
                      SetCommandLineOption_abi_cxx11_(&local_40,(gflags *)0x14afa7,"",pcVar2);
                      bVar1 = std::operator==("",&local_40);
                      std::__cxx11::string::~string((string *)&local_40);
                      if (bVar1) {
                        SetCommandLineOption_abi_cxx11_(&local_40,(gflags *)0x14af50,"",pcVar2);
                        bVar1 = std::operator==("test_string set to \n",&local_40);
                        std::__cxx11::string::~string((string *)&local_40);
                        if (bVar1) {
                          if (fLB::FLAGS_test_bool == '\0') {
                            fprintf(_stderr,"Check failed: %s\n","FLAGS_test_bool");
                            goto LAB_00134de6;
                          }
                          if (fLI::FLAGS_test_int32 == 0x77) {
                            if (fLI64::FLAGS_test_int64 == 0x4a7) {
                              if (fLU::FLAGS_test_uint32 == 0x2e87) {
                                if (fLU64::FLAGS_test_uint64 == 0x1d147) {
                                  FlagSaver::~FlagSaver(&fs);
                                  return;
                                }
                                pcVar2 = "119111";
                                pcVar3 = "FLAGS_test_uint64";
                              }
                              else {
                                pcVar2 = "11911";
                                pcVar3 = "FLAGS_test_uint32";
                              }
                            }
                            else {
                              pcVar2 = "1191";
                              pcVar3 = "FLAGS_test_int64";
                            }
                          }
                          else {
                            pcVar2 = "119";
                            pcVar3 = "FLAGS_test_int32";
                          }
                        }
                        else {
                          pcVar2 = "\"test_string set to \\n\"";
                          pcVar3 = "SetCommandLineOption(\"test_string\", \"\")";
                        }
                      }
                      else {
                        pcVar2 = "\"\"";
                        pcVar3 = "SetCommandLineOption(\"test_double\", \"\")";
                      }
                    }
                    else {
                      pcVar2 = "\"\"";
                      pcVar3 = "SetCommandLineOption(\"test_uint64\", \"\")";
                    }
                  }
                  else {
                    pcVar2 = "\"\"";
                    pcVar3 = "SetCommandLineOption(\"test_uint32\", \"\")";
                  }
                }
                else {
                  pcVar2 = "\"\"";
                  pcVar3 = "SetCommandLineOption(\"test_int64\", \"\")";
                }
              }
              else {
                pcVar2 = "\"\"";
                pcVar3 = "SetCommandLineOption(\"test_int32\", \"\")";
              }
            }
            else {
              pcVar2 = "\"\"";
              pcVar3 = "SetCommandLineOption(\"test_bool\", \"\")";
            }
          }
          else {
            pcVar2 = "\"\"";
            pcVar3 = "SetCommandLineOption(\"test_int64\", \"not a number!\")";
          }
        }
        else {
          pcVar2 = "\"\"";
          pcVar3 = "SetCommandLineOption(\"test_uint64\", \"-1\")";
        }
      }
      else {
        pcVar2 = "\"\"";
        pcVar3 = "SetCommandLineOption(\"test_int32\", \"7000000000000\")";
      }
    }
    else {
      pcVar2 = "\"\"";
      pcVar3 = "SetCommandLineOption(\"test_uint32\", \"-1970\")";
    }
  }
  else {
    pcVar2 = "\"\"";
    pcVar3 = "SetCommandLineOption(\"test_bool\", \"12\")";
  }
  fprintf(_stderr,"Check failed: %s %s %s\n",pcVar2,"==",pcVar3);
LAB_00134de6:
  exit(1);
}

Assistant:

TEST(SetFlagValueTest, IllegalValues) {
  FLAGS_test_bool = true;
  FLAGS_test_int32 = 119;
  FLAGS_test_int64 = 1191;
  FLAGS_test_uint32 = 11911;
  FLAGS_test_uint64 = 119111;

  EXPECT_EQ("",
            SetCommandLineOption("test_bool", "12"));

  EXPECT_EQ("",
            SetCommandLineOption("test_uint32", "-1970"));

  EXPECT_EQ("",
            SetCommandLineOption("test_int32", "7000000000000"));

  EXPECT_EQ("",
            SetCommandLineOption("test_uint64", "-1"));

  EXPECT_EQ("",
            SetCommandLineOption("test_int64", "not a number!"));

  // Test the empty string with each type of input
  EXPECT_EQ("", SetCommandLineOption("test_bool", ""));
  EXPECT_EQ("", SetCommandLineOption("test_int32", ""));
  EXPECT_EQ("", SetCommandLineOption("test_int64", ""));
  EXPECT_EQ("", SetCommandLineOption("test_uint32", ""));
  EXPECT_EQ("", SetCommandLineOption("test_uint64", ""));
  EXPECT_EQ("", SetCommandLineOption("test_double", ""));
  EXPECT_EQ("test_string set to \n", SetCommandLineOption("test_string", ""));

  EXPECT_TRUE(FLAGS_test_bool);
  EXPECT_EQ(119, FLAGS_test_int32);
  EXPECT_EQ(1191, FLAGS_test_int64);
  EXPECT_EQ(11911, FLAGS_test_uint32);
  EXPECT_EQ(119111, FLAGS_test_uint64);
}